

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::MarkReplaced(CWallet *this,uint256 *originalHash,uint256 *newHash)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> wallet_fmt;
  reference ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type *params;
  CWalletTx *wtx_00;
  long in_FS_OFFSET;
  bool success;
  CWalletTx *wtx;
  WalletBatch batch;
  iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  undefined4 in_stack_fffffffffffffe78;
  ChangeType in_stack_fffffffffffffe7c;
  CWalletTx *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  WalletBatch *this_00;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  CWallet *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  bool local_f1;
  undefined1 local_aa [2];
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_a8;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_a0;
  WalletBatch local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe9c,SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
  wallet_fmt._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               *)in_stack_fffffffffffffe80,
              (key_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_a0._M_cur = wallet_fmt._M_cur;
  local_a8._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)in_stack_fffffffffffffe80);
  bVar1 = _GLOBAL__N_1::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                     (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_fffffffffffffe80);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("mi != mapWallet.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x3e0,"bool wallet::CWallet::MarkReplaced(const uint256 &, const uint256 &)");
  }
  ppVar2 = _GLOBAL__N_1::std::__detail::
           _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator*
                     ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  this_01 = (CWallet *)&ppVar2->second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (key_type *)in_stack_fffffffffffffe80);
  if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::allocator<char>::~allocator((allocator<char> *)(local_aa + 1));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe80);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    params = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffffea0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    this_00 = local_48;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar3,__str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::allocator<char>::~allocator((allocator<char> *)local_aa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             chain((CWallet *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    RefreshMempoolStatus
              (in_stack_fffffffffffffe80,
               (Chain *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    wtx_00 = (CWalletTx *)
             GetDatabase((CWallet *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    WalletBatch::WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               (WalletDatabase *)in_stack_fffffffffffffe80,
               SUB41(in_stack_fffffffffffffe7c >> 0x18,0));
    bVar1 = WalletBatch::WriteTx(this_00,wtx_00);
    if (!bVar1) {
      CWalletTx::GetHash((CWalletTx *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
      ;
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffffe80);
      WalletLogPrintf<char[13],std::__cxx11::string>
                (this_01,(ConstevalFormatString<2U>)wallet_fmt._M_cur,(char (*) [13])params,pbVar3);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_f1 = bVar1;
    boost::signals2::
    signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
    ::operator()((signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
                  *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 (uint256 *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (bool)(local_f1 & 1);
    }
    __stack_chk_fail();
  }
  __assert_fail("wtx.mapValue.count(\"replaced_by_txid\") == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                ,0x3e5,"bool wallet::CWallet::MarkReplaced(const uint256 &, const uint256 &)");
}

Assistant:

bool CWallet::MarkReplaced(const uint256& originalHash, const uint256& newHash)
{
    LOCK(cs_wallet);

    auto mi = mapWallet.find(originalHash);

    // There is a bug if MarkReplaced is not called on an existing wallet transaction.
    assert(mi != mapWallet.end());

    CWalletTx& wtx = (*mi).second;

    // Ensure for now that we're not overwriting data
    assert(wtx.mapValue.count("replaced_by_txid") == 0);

    wtx.mapValue["replaced_by_txid"] = newHash.ToString();

    // Refresh mempool status without waiting for transactionRemovedFromMempool or transactionAddedToMempool
    RefreshMempoolStatus(wtx, chain());

    WalletBatch batch(GetDatabase());

    bool success = true;
    if (!batch.WriteTx(wtx)) {
        WalletLogPrintf("%s: Updating batch tx %s failed\n", __func__, wtx.GetHash().ToString());
        success = false;
    }

    NotifyTransactionChanged(originalHash, CT_UPDATED);

    return success;
}